

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

void start_struct_fn(File *fp,int size,char *type_str,char *name,char *whitespace)

{
  char *whitespace_local;
  char *name_local;
  char *type_str_local;
  int size_local;
  File *fp_local;
  
  new_offset(fp,name);
  fp->first_member = 1;
  if (fp->binary == 0) {
    myfprintf(fp->fp,"%s %s = {%s",type_str,name,whitespace);
  }
  else {
    make_room_in_buf(&fp->tables,(long)size);
  }
  return;
}

Assistant:

static void start_struct_fn(File *fp, int size, char *type_str, char *name, char *whitespace) {
  new_offset(fp, name);
  fp->first_member = 1;
  if (fp->binary) {
    make_room_in_buf(&fp->tables, size);
  } else {
    fprintf(fp->fp, "%s %s = {%s", type_str, name, whitespace);
  }
}